

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

void __thiscall Map::removeRegionOwner(Map *this,Player *player)

{
  int iVar1;
  Player *pPVar2;
  reference pvVar3;
  int currentRegion;
  allocator local_41;
  string local_40;
  Player *local_20;
  Player *emptyPlayer;
  Player *player_local;
  Map *this_local;
  
  emptyPlayer = player;
  player_local = (Player *)this;
  pPVar2 = (Player *)operator_new(0x250);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"",&local_41);
  Player::Player(pPVar2,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_20 = pPVar2;
  iVar1 = Player::getZone(emptyPlayer);
  pPVar2 = local_20;
  if ((iVar1 < 1) || (6 < iVar1)) {
    if (6 < iVar1) {
      pvVar3 = std::
               vector<std::pair<Player_*,_Player_*>,_std::allocator<std::pair<Player_*,_Player_*>_>_>
               ::operator[](&this->regionOwners,(long)iVar1);
      pPVar2 = local_20;
      if (pvVar3->first == emptyPlayer) {
        pvVar3 = std::
                 vector<std::pair<Player_*,_Player_*>,_std::allocator<std::pair<Player_*,_Player_*>_>_>
                 ::operator[](&this->regionOwners,(long)iVar1);
        pvVar3->first = pPVar2;
      }
      else {
        pvVar3 = std::
                 vector<std::pair<Player_*,_Player_*>,_std::allocator<std::pair<Player_*,_Player_*>_>_>
                 ::operator[](&this->regionOwners,(long)iVar1);
        pPVar2 = local_20;
        if (pvVar3->second == emptyPlayer) {
          pvVar3 = std::
                   vector<std::pair<Player_*,_Player_*>,_std::allocator<std::pair<Player_*,_Player_*>_>_>
                   ::operator[](&this->regionOwners,(long)iVar1);
          pvVar3->second = pPVar2;
        }
      }
    }
  }
  else {
    pvVar3 = std::
             vector<std::pair<Player_*,_Player_*>,_std::allocator<std::pair<Player_*,_Player_*>_>_>
             ::operator[](&this->regionOwners,(long)iVar1);
    pvVar3->first = pPVar2;
  }
  return;
}

Assistant:

void Map::removeRegionOwner(Player* player) {
    Player* emptyPlayer = new Player("");
    int currentRegion = player->getZone();

    if(currentRegion >0 && currentRegion <7) { // Manhattan
        regionOwners[currentRegion].first = emptyPlayer;
    }
    else if (currentRegion > 6) { // Rest of NY
        if(regionOwners[currentRegion].first == player){ // in first spot
            regionOwners[currentRegion].first = emptyPlayer;
        }
        else if (regionOwners[currentRegion].second == player) { // in second spot
            regionOwners[currentRegion].second = emptyPlayer;
        }
    }
}